

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.h
# Opt level: O1

void __thiscall mkvmuxer::MasteringMetadata::~MasteringMetadata(MasteringMetadata *this)

{
  if (this->r_ != (PrimaryChromaticity *)0x0) {
    operator_delete(this->r_);
  }
  if (this->g_ != (PrimaryChromaticity *)0x0) {
    operator_delete(this->g_);
  }
  if (this->b_ != (PrimaryChromaticity *)0x0) {
    operator_delete(this->b_);
  }
  if (this->white_point_ != (PrimaryChromaticity *)0x0) {
    operator_delete(this->white_point_);
    return;
  }
  return;
}

Assistant:

~MasteringMetadata() {
    delete r_;
    delete g_;
    delete b_;
    delete white_point_;
  }